

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void cppcms::json::details::generic_append<cppcms::json::details::string_append>
               (char *begin,char *end,string_append *a)

{
  byte bVar1;
  undefined8 uVar2;
  char *pcVar3;
  byte *pbVar4;
  char buf [8];
  undefined1 local_38 [5];
  char cStack_33;
  undefined1 uStack_31;
  
  std::__cxx11::string::push_back((char)a->out);
  _local_38 = 0x3030755c;
  pbVar4 = (byte *)begin;
  if (begin != end) {
    do {
      uVar2 = _local_38;
      bVar1 = *pbVar4;
      switch(bVar1) {
      case 8:
        pcVar3 = "\\b";
        break;
      case 9:
        pcVar3 = "\\t";
        break;
      case 10:
        pcVar3 = "\\n";
        break;
      case 0xb:
switchD_001f1ae2_caseD_b:
        if (bVar1 < 0x20) {
          uStack_31 = SUB81(uVar2,7);
          _local_38 = (uint7)CONCAT15("0123456789abcdef"[bVar1 & 0xf],
                                      CONCAT14("0123456789abcdef"[bVar1 >> 4],local_38._0_4_));
          pcVar3 = local_38;
        }
        else {
          pcVar3 = (char *)0x0;
        }
        break;
      case 0xc:
        pcVar3 = "\\f";
        break;
      case 0xd:
        pcVar3 = "\\r";
        break;
      default:
        pcVar3 = "\\\"";
        if (bVar1 != 0x22) {
          if (bVar1 != 0x5c) goto switchD_001f1ae2_caseD_b;
          pcVar3 = "\\\\";
        }
      }
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::append((char *)a->out,(ulong)begin);
        std::__cxx11::string::append((char *)a->out);
        begin = (char *)(pbVar4 + 1);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != (byte *)end);
  }
  std::__cxx11::string::append((char *)a->out,(ulong)begin);
  std::__cxx11::string::push_back((char)a->out);
  return;
}

Assistant:

void generic_append(char const *begin,char const *end,Appender &a)
		{
			a.append('"');
			char const *i,*last;
			char buf[8] = "\\u00";
			for(i=begin,last = begin;i!=end;) {
				char const *addon = 0;
				unsigned char c=*i;
				switch(c) {
				case 0x22: addon = "\\\""; break;
				case 0x5C: addon = "\\\\"; break;
				case '\b': addon = "\\b"; break;
				case '\f': addon = "\\f"; break;
				case '\n': addon = "\\n"; break;
				case '\r': addon = "\\r"; break;
				case '\t': addon = "\\t"; break;
				default:
					if(c<=0x1F) {
						static char const tohex[]="0123456789abcdef";
						buf[4]=tohex[c >>  4];
						buf[5]=tohex[c & 0xF];
						buf[6]=0;
						addon = buf;
					}
				};
				if(addon) {
					a.append(last,i-last);
					a.append(addon);
					i++;
					last = i;
				}
				else {
					i++;
				}
			}
			a.append(last,i-last);
			a.append('"');
		}